

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

int nlohmann::
    json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::array_index(string *s)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  out_of_range *__return_storage_ptr__;
  long *plVar4;
  undefined8 uVar5;
  size_type *psVar6;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __nptr = (s->_M_dataplus)._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr,(char **)&local_68,10);
  if (local_68._M_dataplus._M_p == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if ((int)lVar3 == lVar3) {
    if (*piVar2 != 0x22) {
      if (*piVar2 == 0) {
        *piVar2 = iVar1;
      }
      if ((long)local_68._M_dataplus._M_p - (long)__nptr == s->_M_string_length) {
        return (int)lVar3;
      }
      __return_storage_ptr__ = (out_of_range *)__cxa_allocate_exception(0x20);
      std::operator+(&local_48,"unresolved reference token \'",s);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_68._M_dataplus._M_p = (pointer)*plVar4;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_68._M_dataplus._M_p == psVar6) {
        local_68.field_2._M_allocated_capacity = *psVar6;
        local_68.field_2._8_8_ = plVar4[3];
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar6;
      }
      local_68._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      detail::out_of_range::create(__return_storage_ptr__,0x194,&local_68);
      __cxa_throw(__return_storage_ptr__,&detail::out_of_range::typeinfo,
                  detail::exception::~exception);
    }
  }
  uVar5 = std::__throw_out_of_range("stoi");
  if (*piVar2 == 0) {
    *piVar2 = iVar1;
  }
  _Unwind_Resume(uVar5);
}

Assistant:

static int array_index(const std::string& s) {
		std::size_t processed_chars = 0;
		const int res = std::stoi(s, &processed_chars);

		// check if the string was completely read
		if (JSON_UNLIKELY(processed_chars != s.size())) {
			JSON_THROW(detail::out_of_range::create(404, "unresolved reference token '" + s + "'"));
		}

		return res;
	}